

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O0

void __thiscall
ImDrawList::AddBezierCubic
          (ImDrawList *this,ImVec2 *p1,ImVec2 *p2,ImVec2 *p3,ImVec2 *p4,ImU32 col,float thickness,
          int num_segments)

{
  ImDrawList *in_RCX;
  undefined8 in_RSI;
  int num_segments_00;
  ImVec2 *in_RDI;
  undefined8 in_R8;
  float in_R9D;
  undefined4 in_XMM0_Da;
  ImVec2 *unaff_retaddr;
  
  num_segments_00 = (int)((ulong)in_RSI >> 0x20);
  if (((uint)in_R9D & 0xff000000) != 0) {
    PathLineTo((ImDrawList *)CONCAT44(in_R9D,in_XMM0_Da),in_RDI);
    PathBezierCubicCurveTo
              ((ImDrawList *)p4,(ImVec2 *)CONCAT44(col,thickness),unaff_retaddr,in_RDI,
               num_segments_00);
    PathStroke(in_RCX,(ImU32)((ulong)in_R8 >> 0x20),SUB81((ulong)in_R8 >> 0x18,0),in_R9D);
  }
  return;
}

Assistant:

void ImDrawList::AddBezierCubic(const ImVec2& p1, const ImVec2& p2, const ImVec2& p3, const ImVec2& p4, ImU32 col, float thickness, int num_segments)
{
    if ((col & IM_COL32_A_MASK) == 0)
        return;

    PathLineTo(p1);
    PathBezierCubicCurveTo(p2, p3, p4, num_segments);
    PathStroke(col, false, thickness);
}